

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O3

void __thiscall
agge::tests::RendererTests::RenderSingleLineRasterAtProperPosition(RendererTests *this)

{
  cell *pcVar1;
  pointer psVar2;
  pointer psVar3;
  bool bVar4;
  int iVar5;
  cell *pcVar6;
  cell *pcVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  scanline_cells sVar11;
  mask<8UL> mask2;
  mask<8UL> mask1;
  scanline_cells cells2 [1];
  scanline_cells cells1 [1];
  scanline_mockup local_168;
  LocationInfo local_140;
  undefined1 local_118 [40];
  string local_f0;
  mask<8UL> local_d0;
  pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> local_a8;
  pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> local_98;
  undefined1 local_88 [16];
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  cell local_64;
  undefined1 local_58 [16];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  
  local_168.excepted_y = -1000000;
  local_168.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_168.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_168.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_168._25_8_ = 0;
  local_168._current_y = 0x7fffffff;
  local_98.second = (cell *)&stack0xffffffffffffffcc;
  local_58._0_8_ = 0;
  local_48 = 0;
  uStack_3c = 0;
  local_58._8_8_ = 0xb00000011;
  uStack_44 = 0xfffffffd;
  uStack_40 = 0xd;
  local_38 = 0xfffffff2;
  local_98.first = (cell *)local_58;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,1>
            ((mask<8ul> *)&local_d0,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [1])
             &local_98,0xd);
  if (0 < local_d0._height) {
    iVar9 = local_d0._min_y;
    do {
      sVar11 = mocks::mask<8UL>::operator[](&local_d0,iVar9);
      pcVar7 = sVar11.second;
      pcVar6 = sVar11.first;
      bVar4 = anon_unknown_1::scanline_mockup::begin(&local_168,iVar9);
      if (bVar4) {
        if (pcVar6 != pcVar7) {
          uVar8 = 0;
LAB_0016ca6c:
          iVar10 = pcVar6->x;
          iVar5 = 0;
          pcVar1 = pcVar6;
          do {
            pcVar6 = pcVar1 + 1;
            iVar5 = iVar5 + pcVar1->area;
            uVar8 = uVar8 + pcVar1->cover;
            if (pcVar6 == pcVar7) break;
            pcVar1 = pcVar6;
          } while (pcVar6->x == iVar10);
          if (iVar5 != 0) {
            anon_unknown_1::scanline_mockup::add_cell(&local_168,iVar10,uVar8 * 0x200 - iVar5);
            iVar10 = iVar10 + 1;
          }
          if (pcVar6 != pcVar7) {
            iVar5 = pcVar6->x - iVar10;
            if ((uVar8 & 0x7fffff) != 0 && iVar5 != 0) {
              anon_unknown_1::scanline_mockup::add_span(&local_168,iVar10,iVar5,uVar8 * 0x200);
            }
            goto LAB_0016ca6c;
          }
        }
        anon_unknown_1::scanline_mockup::commit(&local_168);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < local_d0._height + local_d0._min_y);
  }
  local_140.filename._M_dataplus._M_p = (pointer)&local_140.filename.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_118,&local_140.filename,0x170);
  psVar3 = local_168.spans_log.
           super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (pointer)CONCAT71(local_168.spans_log.
                             super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                             ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                             local_168.spans_log.
                             super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                             ._M_impl.super__Vector_impl_data._M_finish._0_1_);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,2ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((ut *)&DAT_001a1db0,
             (span (*) [2])
             local_168.spans_log.
             super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              *)psVar2,(LocationInfo *)local_118);
  if ((undefined1 *)CONCAT44(local_118._4_4_,local_118._0_4_) != local_118 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_118._4_4_,local_118._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.filename._M_dataplus._M_p != &local_140.filename.field_2) {
    operator_delete(local_140.filename._M_dataplus._M_p);
  }
  local_a8.second = &local_64;
  local_78 = 0;
  uStack_6c = 0;
  local_88._0_8_ = 2;
  local_88._8_8_ = 0xa00000011;
  uStack_74 = 0xfffffffd;
  uStack_70 = 0xb;
  local_68 = 0xfffffff2;
  local_a8.first = (cell *)local_88;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,1>
            ((mask<8ul> *)local_118,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [1])
             &local_a8,-0x83);
  if (psVar2 != psVar3) {
    local_168.spans_log.
    super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = SUB81(psVar3,0);
    local_168.spans_log.
    super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = (undefined7)((ulong)psVar3 >> 8);
  }
  if (0 < (int)local_118._8_4_) {
    iVar9 = local_118._4_4_;
    do {
      sVar11 = mocks::mask<8UL>::operator[]((mask<8UL> *)local_118,iVar9);
      pcVar7 = sVar11.second;
      pcVar6 = sVar11.first;
      bVar4 = anon_unknown_1::scanline_mockup::begin(&local_168,iVar9);
      if (bVar4) {
        if (pcVar6 != pcVar7) {
          uVar8 = 0;
LAB_0016cc30:
          iVar10 = pcVar6->x;
          iVar5 = 0;
          pcVar1 = pcVar6;
          do {
            pcVar6 = pcVar1 + 1;
            iVar5 = iVar5 + pcVar1->area;
            uVar8 = uVar8 + pcVar1->cover;
            if (pcVar6 == pcVar7) break;
            pcVar1 = pcVar6;
          } while (pcVar6->x == iVar10);
          if (iVar5 != 0) {
            anon_unknown_1::scanline_mockup::add_cell(&local_168,iVar10,uVar8 * 0x200 - iVar5);
            iVar10 = iVar10 + 1;
          }
          if (pcVar6 != pcVar7) {
            iVar5 = pcVar6->x - iVar10;
            if ((uVar8 & 0x7fffff) != 0 && iVar5 != 0) {
              anon_unknown_1::scanline_mockup::add_span(&local_168,iVar10,iVar5,uVar8 * 0x200);
            }
            goto LAB_0016cc30;
          }
        }
        anon_unknown_1::scanline_mockup::commit(&local_168);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < (int)(local_118._8_4_ + local_118._4_4_));
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_140,&local_f0,0x182);
  psVar2 = local_168.spans_log.
           super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,2ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((ut *)&DAT_001a1dd0,
             (span (*) [2])
             local_168.spans_log.
             super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
              *)CONCAT71(local_168.spans_log.
                         super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                         local_168.spans_log.
                         super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                         ._M_impl.super__Vector_impl_data._M_finish._0_1_),&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.filename._M_dataplus._M_p != &local_140.filename.field_2) {
    operator_delete(local_140.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((void *)local_118._16_8_ != (void *)0x0) {
    operator_delete((void *)local_118._16_8_);
  }
  if (local_d0._cells.
      super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0._cells.
                    super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (psVar2 != (pointer)0x0) {
    operator_delete(psVar2);
  }
  return;
}

Assistant:

scanline_mockup(bool inprogress = true)
					: excepted_y(-1000000), _inprogress(inprogress), _current_y(0x7fffffff)
				{	}